

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_log.c
# Opt level: O1

void srunner_init_logging(SRunner *sr,print_output print_mode)

{
  List *pLVar1;
  FILE *pFVar2;
  
  pLVar1 = check_list_create();
  sr->loglst = pLVar1;
  srunner_register_lfun(sr,_stdout,0,stdout_lfun,print_mode);
  pFVar2 = srunner_open_lfile(sr);
  if (pFVar2 != (FILE *)0x0) {
    srunner_register_lfun(sr,pFVar2,(uint)(pFVar2 != _stdout),lfile_lfun,print_mode);
  }
  pFVar2 = srunner_open_xmlfile(sr);
  if (pFVar2 != (FILE *)0x0) {
    srunner_register_lfun(sr,pFVar2,(uint)(pFVar2 != _stdout),xml_lfun,print_mode);
  }
  pFVar2 = srunner_open_tapfile(sr);
  if (pFVar2 != (FILE *)0x0) {
    srunner_register_lfun(sr,pFVar2,(uint)(pFVar2 != _stdout),tap_lfun,print_mode);
  }
  srunner_send_evt(sr,(void *)0x0,CLINITLOG_SR);
  return;
}

Assistant:

void srunner_init_logging(SRunner * sr, enum print_output print_mode)
{
    FILE *f;

    sr->loglst = check_list_create();
#if ENABLE_SUBUNIT
    if(print_mode != CK_SUBUNIT)
#endif
        srunner_register_lfun(sr, stdout, 0, stdout_lfun, print_mode);
#if ENABLE_SUBUNIT
    else
        srunner_register_lfun(sr, stdout, 0, subunit_lfun, print_mode);
#endif
    f = srunner_open_lfile(sr);
    if(f)
    {
        srunner_register_lfun(sr, f, f != stdout, lfile_lfun, print_mode);
    }
    f = srunner_open_xmlfile(sr);
    if(f)
    {
        srunner_register_lfun(sr, f, f != stdout, xml_lfun, print_mode);
    }
    f = srunner_open_tapfile(sr);
    if(f)
    {
        srunner_register_lfun(sr, f, f != stdout, tap_lfun, print_mode);
    }
    srunner_send_evt(sr, NULL, CLINITLOG_SR);
}